

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O3

void pad(Sarray *state,int StartIndex)

{
  int iVar1;
  ulong *puVar2;
  pointer pvVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  
  iVar6 = BitRate + 7;
  if (-1 < BitRate) {
    iVar6 = BitRate;
  }
  iVar6 = iVar6 >> 3;
  iVar8 = StartIndex + 7;
  if (-1 < StartIndex) {
    iVar8 = StartIndex;
  }
  pvVar3 = (state->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)((StartIndex / 0x28) % 5);
  lVar4 = *(long *)&pvVar3[(iVar8 >> 3) % 5].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data;
  uVar5 = *(ulong *)(lVar4 + lVar9 * 8);
  bVar7 = (byte)(StartIndex % 8 << 3);
  if (iVar6 - StartIndex == 1) {
    *(ulong *)(lVar4 + lVar9 * 8) = uVar5 ^ 0x86L << (bVar7 & 0x3f);
    return;
  }
  iVar8 = iVar6 + -1;
  iVar1 = iVar6 + 6;
  if (-1 < iVar8) {
    iVar1 = iVar8;
  }
  *(ulong *)(lVar4 + lVar9 * 8) = uVar5 ^ 6L << (bVar7 & 0x3f);
  puVar2 = (ulong *)(*(long *)&pvVar3[(iVar1 >> 3) % 5].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data + (long)((iVar8 / 0x28) % 5) * 8);
  *puVar2 = *puVar2 ^ 0x80L << ((((char)iVar6 - ((byte)iVar1 & 0xf8)) + -1) * '\b' & 0x3f);
  return;
}

Assistant:

void pad(Sarray &state, int StartIndex){
    int toInsert = (BitRate/8)-StartIndex;
    if(toInsert == 1){
        Absorb(0b10000110, state, StartIndex);
    }else{
        Absorb(0b00000110, state, StartIndex);
        for(int t = 1; t < toInsert-1; t++){
            Absorb(0b00000000, state, StartIndex+t);
        }
        Absorb(0b10000000, state, StartIndex+toInsert-1);
    }
}